

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O1

void fake_clib_func(_func_void_int_void_ptr *callback,void *user)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"before",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  (*callback)(0x2a,user);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"after",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void fake_clib_func(void (*callback)(int input, void *user), void *user) {
  std::cout << "before" << std::endl;
  callback(42, user);
  std::cout << "after" << std::endl;
}